

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::allocate<spirv_cross::SPIRVariable&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,SPIRVariable *p)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint32_t uVar1;
  ID IVar2;
  bool bVar3;
  undefined2 uVar4;
  bool bVar5;
  bool bVar6;
  BlockID BVar7;
  bool bVar8;
  bool bVar9;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var10;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var11;
  size_t sVar12;
  ulong uVar13;
  SPIRVariable *pSVar14;
  
  this_00 = &this->vacants;
  sVar12 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
  if (sVar12 == 0) {
    sVar12 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
             .buffer_size;
    uVar13 = (ulong)(this->start_object_count << ((byte)sVar12 & 0x1f));
    _Var10.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(uVar13 * 0xb0);
    if (_Var10.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl ==
        (SPIRVariable *)0x0) {
      return (SPIRVariable *)0x0;
    }
    if (uVar13 != 0) {
      sVar12 = 0;
      _Var11._M_head_impl =
           (SPIRVariable *)
           _Var10.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,sVar12 + 1);
        sVar12 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar12] =
             _Var11._M_head_impl;
        sVar12 = sVar12 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar12;
        _Var11._M_head_impl = _Var11._M_head_impl + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      sVar12 = (this->memory).
               super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
               .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar12 + 1);
    sVar12 = (this->memory).
             super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
             .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .ptr[sVar12]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
         _Var10.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
    .buffer_size = sVar12 + 1;
    sVar12 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar14 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar12 - 1];
    if (sVar12 == 0) goto LAB_00277204;
  }
  else {
    pSVar14 = (this_00->super_VectorView<spirv_cross::SPIRVariable_*>).ptr[sVar12 - 1];
  }
  SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar12 - 1);
LAB_00277204:
  (pSVar14->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar14->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_003d5600;
  uVar1 = p->decoration;
  IVar2.id = (p->initializer).id;
  *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
       *(undefined8 *)&(p->super_IVariant).field_0xc;
  pSVar14->decoration = uVar1;
  pSVar14->initializer = (ID)IVar2.id;
  (pSVar14->basevariable).id = (p->basevariable).id;
  (pSVar14->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar14->dereference_chain).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar14->dereference_chain).stack_storage;
  (pSVar14->dereference_chain).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->dereference_chain,&p->dereference_chain);
  bVar3 = p->statically_assigned;
  uVar4 = *(undefined2 *)&p->field_0x5a;
  IVar2.id = (p->static_expression).id;
  pSVar14->compat_builtin = p->compat_builtin;
  pSVar14->statically_assigned = bVar3;
  *(undefined2 *)&pSVar14->field_0x5a = uVar4;
  pSVar14->static_expression = (ID)IVar2.id;
  (pSVar14->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
       0;
  (pSVar14->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
       (TypedID<(spirv_cross::Types)0> *)&(pSVar14->dependees).stack_storage;
  (pSVar14->dependees).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar14->dependees,&p->dependees);
  bVar3 = p->phi_variable;
  bVar5 = p->allocate_temporary_copy;
  bVar6 = p->remapped_variable;
  uVar1 = p->remapped_components;
  BVar7.id = (p->dominator).id;
  bVar8 = p->loop_variable;
  bVar9 = p->loop_variable_enable;
  uVar4 = *(undefined2 *)&p->field_0xa6;
  pSVar14->deferred_declaration = p->deferred_declaration;
  pSVar14->phi_variable = bVar3;
  pSVar14->allocate_temporary_copy = bVar5;
  pSVar14->remapped_variable = bVar6;
  pSVar14->remapped_components = uVar1;
  pSVar14->dominator = (BlockID)BVar7.id;
  pSVar14->loop_variable = bVar8;
  pSVar14->loop_variable_enable = bVar9;
  *(undefined2 *)&pSVar14->field_0xa6 = uVar4;
  pSVar14->parameter = p->parameter;
  return pSVar14;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}